

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::GridLocalPolynomial::getSubGraph<(TasGrid::RuleLocal::erule)0>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GridLocalPolynomial *this,
          vector<int,_std::allocator<int>_> *point)

{
  int *piVar1;
  iterator __position;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  int slot;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> p;
  uint local_b4;
  vector<int,_std::allocator<int>_> local_b0;
  void *local_98;
  iterator iStack_90;
  int *local_88;
  int local_74;
  vector<int,_std::allocator<int>_> local_70;
  vector<bool,_std::allocator<bool>_> local_58;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_70,(vector<int,_std::allocator<int>_> *)point);
  local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  ::std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)(this->super_BaseCanonicalGrid).points.cache_num_indexes,
             (bool *)&local_b0,(allocator_type *)&local_98);
  iVar6 = (this->super_BaseCanonicalGrid).num_dimensions;
  piVar4 = (int *)operator_new(4);
  local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       piVar4 + 1;
  *piVar4 = 0;
  local_98 = (void *)0x0;
  iStack_90._M_current = (int *)0x0;
  local_88 = (int *)0x0;
  local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       piVar4;
  local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (0 < iVar6) {
    iVar6 = iVar6 * 4;
    do {
      iVar3 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish[-1];
      if (iVar3 < iVar6) {
        iVar2 = iVar3 + 3;
        if (-1 < iVar3) {
          iVar2 = iVar3;
        }
        iVar2 = iVar2 >> 2;
        if (iStack_90._M_current == local_88) {
          ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_98,iStack_90,
                     local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + iVar2);
        }
        else {
          *iStack_90._M_current =
               local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar2];
          iStack_90._M_current = iStack_90._M_current + 1;
        }
        iVar3 = RuleLocal::getKid<(TasGrid::RuleLocal::erule)0>
                          (iStack_90._M_current[-1],
                           local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish[-1] % 4);
        local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2] = iVar3;
        local_b4 = MultiIndexSet::getSlot
                             (&(this->super_BaseCanonicalGrid).points,
                              local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        if (local_b4 != 0xffffffff) {
          uVar5 = local_b4 + 0x3f;
          if (-1 < (int)local_b4) {
            uVar5 = local_b4;
          }
          if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p
               [(long)((int)uVar5 >> 6) +
                ((ulong)(((long)(int)local_b4 & 0x800000000000003fU) < 0x8000000000000001) - 1)] >>
               ((ulong)local_b4 & 0x3f) & 1) == 0) {
            __position._M_current =
                 (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,
                         (int *)&local_b4);
            }
            else {
              *__position._M_current = local_b4;
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar5 = local_b4 + 0x3f;
            if (-1 < (long)(int)local_b4) {
              uVar5 = local_b4;
            }
            local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [(long)((int)uVar5 >> 6) +
             ((ulong)(((long)(int)local_b4 & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
                 local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)((int)uVar5 >> 6) +
                  ((ulong)(((long)(int)local_b4 & 0x800000000000003fU) < 0x8000000000000001) - 1)] |
                 1L << ((byte)local_b4 & 0x3f);
            local_74 = 0;
            if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_b0,
                         (iterator)
                         local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_74);
              piVar4 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            }
            else {
              *local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0;
              local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
              piVar4 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            }
            goto LAB_0018d30e;
          }
        }
        piVar4 = iStack_90._M_current + -1;
        iStack_90._M_current = iStack_90._M_current + -1;
        local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2] = *piVar4;
        local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1] =
             local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish[-1] + 1;
        piVar4 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        iVar3 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish[-2];
        iVar2 = iVar3 + 3;
        if (-1 < iVar3) {
          iVar2 = iVar3;
        }
        piVar1 = iStack_90._M_current + -1;
        iStack_90._M_current = iStack_90._M_current + -1;
        local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 >> 2] = *piVar1;
        local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish[-2] =
             local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish[-2] + 1;
        local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
      }
LAB_0018d30e:
    } while (*piVar4 < iVar6);
    if ((local_98 != (void *)0x0) &&
       (operator_delete(local_98,(long)local_88 - (long)local_98),
       piVar4 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,
       local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start == (int *)0x0)) goto LAB_0018d3e4;
  }
  operator_delete(piVar4,(long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage - (long)piVar4);
LAB_0018d3e4:
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> GridLocalPolynomial::getSubGraph(std::vector<int> const &point) const{
    std::vector<int> graph, p = point;
    std::vector<bool> used(points.getNumIndexes(), false);
    int max_1d_kids = RuleLocal::getMaxNumKids<effrule>();
    int max_kids = max_1d_kids * num_dimensions;

    std::vector<int> monkey_count(1, 0), monkey_tail;

    while(monkey_count[0] < max_kids){
        if (monkey_count.back() < max_kids){
            int dim = monkey_count.back() / max_1d_kids;
            monkey_tail.push_back(p[dim]);
            p[dim] = RuleLocal::getKid<effrule>(monkey_tail.back(), monkey_count.back() % max_1d_kids);
            int slot = points.getSlot(p);
            if ((slot == -1) || used[slot]){ // this kid is missing
                p[dim] = monkey_tail.back();
                monkey_tail.pop_back();
                monkey_count.back()++;
            }else{ // found kid, go deeper in the graph
                graph.push_back(slot);
                used[slot] = true;
                monkey_count.push_back(0);
            }
        }else{
            monkey_count.pop_back();
            int dim = monkey_count.back() / max_1d_kids;
            p[dim] = monkey_tail.back();
            monkey_tail.pop_back();
            monkey_count.back()++;
        }
    }

    return graph;
}